

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

cmArgumentParser<void> * __thiscall
cmArgumentParser<void>::
Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          (cmArgumentParser<void> *this,static_string_view name,
          optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *ref)

{
  string_view name_00;
  anon_class_8_1_ba1d73f3 local_60;
  KeywordAction local_58;
  cmArgumentParser<void> *local_38;
  char *pcStack_30;
  optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_28;
  optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *ref_local;
  cmArgumentParser<void> *this_local;
  static_string_view name_local;
  
  pcStack_30 = name.super_string_view._M_str;
  local_38 = (cmArgumentParser<void> *)name.super_string_view._M_len;
  local_60.ref = ref;
  local_28 = ref;
  ref_local = (optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)this;
  this_local = local_38;
  name_local.super_string_view._M_len = (size_t)pcStack_30;
  std::function<void(ArgumentParser::Instance&)>::
  function<cmArgumentParser<void>::Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cm::static_string_view,std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>&)::_lambda(ArgumentParser::Instance&)_1_,void>
            ((function<void(ArgumentParser::Instance&)> *)&local_58,&local_60);
  name_00._M_str = pcStack_30;
  name_00._M_len = (size_t)local_38;
  ArgumentParser::Base::Bind(&this->super_Base,name_00,&local_58);
  std::function<void_(ArgumentParser::Instance_&)>::~function(&local_58);
  return this;
}

Assistant:

cmArgumentParser& Bind(cm::static_string_view name, T& ref)
  {
    this->Base::Bind(name, [&ref](Instance& instance) { instance.Bind(ref); });
    return *this;
  }